

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseables.cpp
# Opt level: O1

void __thiscall glslang::TBuiltInParseablesHlsl::createMatTimesMat(TBuiltInParseablesHlsl *this)

{
  int dim0;
  TString *s;
  int yCols;
  int dim1;
  int xCols;
  int dim1_00;
  int retRows;
  
  s = &(this->super_TBuiltInParseables).commonBuiltins;
  dim0 = 1;
  do {
    dim1_00 = 1;
    do {
      dim1 = 1;
      do {
        anon_unknown.dwarf_d96793::AppendTypeName(s,"M","F",dim0,dim1);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(s," ");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(s,"mul");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(s,"(");
        anon_unknown.dwarf_d96793::AppendTypeName(s,"M","F",dim0,dim1_00);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(s,", ");
        anon_unknown.dwarf_d96793::AppendTypeName(s,"M","F",dim1_00,dim1);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(s,");\n");
        dim1 = dim1 + 1;
      } while (dim1 != 5);
      anon_unknown.dwarf_d96793::AppendTypeName(s,"V","F",dim0,1);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(s," ");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(s,"mul");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(s,"(");
      anon_unknown.dwarf_d96793::AppendTypeName(s,"M","F",dim0,dim1_00);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(s,", ");
      anon_unknown.dwarf_d96793::AppendTypeName(s,"V","F",dim1_00,1);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(s,");\n");
      anon_unknown.dwarf_d96793::AppendTypeName(s,"V","F",dim1_00,1);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(s," ");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(s,"mul");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(s,"(");
      anon_unknown.dwarf_d96793::AppendTypeName(s,"V","F",dim0,1);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(s,", ");
      anon_unknown.dwarf_d96793::AppendTypeName(s,"M","F",dim0,dim1_00);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(s,");\n");
      dim1_00 = dim1_00 + 1;
    } while (dim1_00 != 5);
    dim0 = dim0 + 1;
  } while (dim0 != 5);
  return;
}

Assistant:

void TBuiltInParseablesHlsl::createMatTimesMat()
{
    TString& s = commonBuiltins;

    for (int xRows = 1; xRows <=4; xRows++) {
        for (int xCols = 1; xCols <=4; xCols++) {
            const int yRows = xCols;
            for (int yCols = 1; yCols <=4; yCols++) {
                const int retRows = xRows;
                const int retCols = yCols;

                // Create a mat * mat of the appropriate dimensions
                AppendTypeName(s, "M", "F", retRows, retCols);  // add return type
                s.append(" ");                                  // space between type and name
                s.append("mul");                                // intrinsic name
                s.append("(");                                  // open paren

                AppendTypeName(s, "M", "F", xRows, xCols);      // add X input
                s.append(", ");
                AppendTypeName(s, "M", "F", yRows, yCols);      // add Y input

                s.append(");\n");                               // close paren
            }

            // Create M*V
            AppendTypeName(s, "V", "F", xRows, 1);          // add return type
            s.append(" ");                                  // space between type and name
            s.append("mul");                                // intrinsic name
            s.append("(");                                  // open paren

            AppendTypeName(s, "M", "F", xRows, xCols);      // add X input
            s.append(", ");
            AppendTypeName(s, "V", "F", xCols, 1);          // add Y input

            s.append(");\n");                               // close paren

            // Create V*M
            AppendTypeName(s, "V", "F", xCols, 1);          // add return type
            s.append(" ");                                  // space between type and name
            s.append("mul");                                // intrinsic name
            s.append("(");                                  // open paren

            AppendTypeName(s, "V", "F", xRows, 1);          // add Y input
            s.append(", ");
            AppendTypeName(s, "M", "F", xRows, xCols);      // add X input

            s.append(");\n");                               // close paren
        }
    }
}